

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

bool __thiscall
HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::erase
          (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
           *this,KeyType *key)

{
  bool bVar1;
  type puVar2;
  ulong uVar3;
  u64 uVar4;
  u8 *in_RSI;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int> *in_RDI;
  u64 dist;
  u64 shift;
  u64 capacity;
  Entry *entryArray;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  undefined7 in_stack_ffffffffffffff98;
  uchar in_stack_ffffffffffffff9f;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
  *in_stack_ffffffffffffffd0;
  u64 *in_stack_ffffffffffffffd8;
  u64 *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = findPosition((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                        *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (KeyType *)in_RDI,in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                       (u64 *)in_stack_ffffffffffffffd0);
  if (bVar1) {
    std::
    unique_ptr<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
    ::get(&in_RDI->entries);
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI
                        ,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    *puVar2 = '\0';
    in_RDI->numElements = in_RDI->numElements - 1;
    uVar3 = in_RDI->tableSizeMask + 1;
    if ((uVar3 == 0x80) || (uVar3 >> 2 <= in_RDI->numElements)) {
      while( true ) {
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            in_RDI,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        bVar1 = occupied(in_RDI,*puVar2);
        if (!bVar1) break;
        uVar4 = distanceFromIdealSlot
                          (in_RDI,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        if (uVar4 == 0) {
          return true;
        }
        HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
        ::operator=((HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                     *)in_RDI,
                    (HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                     *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            in_RDI,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        in_stack_ffffffffffffff9f = *puVar2;
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            in_RDI,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        *puVar2 = in_stack_ffffffffffffff9f;
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            in_RDI,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        *puVar2 = '\0';
      }
      bVar1 = true;
    }
    else {
      shrinkTable(in_stack_ffffffffffffffd0);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool erase(const KeyType& key) {
    u64 pos, startPos, maxPos;
    u8 meta;
    if (!findPosition(key, meta, startPos, maxPos, pos)) return false;
    // delete element at position pos
    Entry* entryArray = entries.get();
    entryArray[pos].~Entry();
    metadata[pos] = 0;

    // retain at least a quarter of slots occupied, otherwise shrink the table
    // if its not at its minimum size already
    --numElements;
    u64 capacity = tableSizeMask + 1;
    if (capacity != 128 && numElements < capacity / 4) {
      shrinkTable();
      return true;
    }

    // shift elements after pos backwards
    while (true) {
      u64 shift = (pos + 1) & tableSizeMask;
      if (!occupied(metadata[shift])) return true;

      u64 dist = distanceFromIdealSlot(shift);
      if (dist == 0) return true;

      entryArray[pos] = std::move(entryArray[shift]);
      metadata[pos] = metadata[shift];
      metadata[shift] = 0;
      pos = shift;
    }
  }